

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O0

int annMaxSpread(ANNpointArray pa,ANNidxArray pidx,int n,int dim)

{
  int in_ECX;
  int in_EDX;
  ANNidxArray in_RSI;
  ANNpointArray in_RDI;
  ANNcoord AVar1;
  ANNcoord spr;
  int d;
  ANNcoord max_spr;
  int max_dim;
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_24;
  undefined4 local_4;
  
  local_24 = 0;
  local_30 = 0.0;
  if (in_EDX == 0) {
    local_4 = 0;
  }
  else {
    for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
      AVar1 = annSpread(in_RDI,in_RSI,in_EDX,local_34);
      if (local_30 < AVar1) {
        local_24 = local_34;
        local_30 = AVar1;
      }
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

int annMaxSpread(      // compute dimension of max spread
    ANNpointArray pa,  // point array
    ANNidxArray pidx,  // point indices
    int n,             // number of points
    int dim)           // dimension of space
{
    int max_dim = 0;       // dimension of max spread
    ANNcoord max_spr = 0;  // amount of max spread

    if (n == 0) return max_dim;  // no points, who cares?

    for (int d = 0; d < dim; d++) {  // compute spread along each dim
        ANNcoord spr = annSpread(pa, pidx, n, d);
        if (spr > max_spr) {  // bigger than current max
            max_spr = spr;
            max_dim = d;
        }
    }
    return max_dim;
}